

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<std::__cxx11::string_const&,char_const*>::output_int<char_const*>
               (ostream *os,char *value)

{
  char *value_local;
  ostream *os_local;
  
  return false;
}

Assistant:

static bool output_int(std::ostream& os, T value)
    {
        if constexpr ((std::is_integral_v<T> && sizeof(T) == 1) || std::is_same_v<T, wchar_t>) {
            os << (unsigned long)value;
            return true;
        }
        else if constexpr (std::is_integral_v<T> || std::is_floating_point_v<T>) {
            os << value;
            return true;
        }

        return false;
    }